

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O1

void golf_storage_save(void)

{
  int iVar1;
  size_t sVar2;
  char *buf;
  FILE *__s;
  
  sVar2 = json_serialization_size(_storage_json_val);
  iVar1 = (int)sVar2;
  buf = (char *)golf_alloc_tracked((long)iVar1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/storage.c"
                                  );
  json_serialize_to_buffer(_storage_json_val,buf,(long)iVar1);
  __s = fopen("storage.json","wb");
  fwrite(buf,(long)(iVar1 + -1),1,__s);
  fclose(__s);
  golf_free_tracked(buf);
  return;
}

Assistant:

void golf_storage_save(void) {
    int buf_size = (int)json_serialization_size(_storage_json_val);
    char *buf = golf_alloc(buf_size);
    json_serialize_to_buffer(_storage_json_val, buf, buf_size);

    // use buf_size-1 because we don't need to write out the null byte
#if GOLF_PLATFORM_WINDOWS | GOLF_PLATFORM_LINUX

    _save_buf_to_file("storage.json", buf, buf_size - 1);

#elif GOLF_PLATFORM_ANDROID

    ANativeActivity *native_activity = sapp_android_get_native_activity();
    const char *internal_path = native_activity->internalDataPath;
    char storage_path[1024];
    snprintf(storage_path, 1024, "%s/storage.json", internal_path);

    _save_buf_to_file(storage_path, buf, buf_size - 1);

#elif GOLF_PLATFORM_IOS

    NSString *appSupportDir = [NSSearchPathForDirectoriesInDomains(NSApplicationSupportDirectory, NSUserDomainMask, YES) lastObject];
    const char *app_support_path = [appSupportDir UTF8String];
    char storage_path[1024];
    snprintf(storage_path, 1024, "%s/storage.json", app_support_path);

    _save_buf_to_file(storage_path, buf, buf_size - 1);

#elif GOLF_PLATFORM_EMSCRIPTEN

    _save_buf_to_file("/opengolf_persistent_data/storage.json", buf, buf_size - 1);

    EM_ASM(
            FS.syncfs(function (err) {
                assert(!err);
                console.log("SAVED");
                });
          );

#else

#error Unknown platform

#endif

    golf_free(buf);
}